

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

int32 write_kd_trees(char *outfile,kd_tree_node_t **trees,uint32 n_trees)

{
  FILE *__stream;
  uint local_34;
  uint32 i;
  FILE *fp;
  uint32 n_trees_local;
  kd_tree_node_t **trees_local;
  char *outfile_local;
  
  __stream = fopen(outfile,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                   ,0x16b,"Failed to open %s",outfile);
    outfile_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"KD-TREES\n");
    fprintf(__stream,"version %d\n",1);
    fprintf(__stream,"n_trees %d\n",(ulong)n_trees);
    for (local_34 = 0; local_34 < n_trees; local_34 = local_34 + 1) {
      fprintf(__stream,"TREE %d\n",(ulong)local_34);
      fprintf(__stream,"n_density %d\n",(ulong)trees[local_34]->n_density);
      fprintf(__stream,"n_comp %d\n",(ulong)trees[local_34]->n_comp);
      fprintf(__stream,"n_level %d\n",(ulong)trees[local_34]->n_level);
      fprintf(__stream,"threshold %f\n",(double)(float)trees[local_34]->threshold);
      write_kd_nodes((FILE *)__stream,trees[local_34],trees[local_34]->n_level);
      fprintf(__stream,"\n");
    }
    fclose(__stream);
    outfile_local._4_4_ = 0;
  }
  return outfile_local._4_4_;
}

Assistant:

int32
write_kd_trees(const char *outfile, kd_tree_node_t **trees, uint32 n_trees)
{
	FILE *fp;
	uint32 i;

	if ((fp = fopen(outfile, "w"))  == NULL) {
		E_ERROR_SYSTEM("Failed to open %s", outfile);
		return -1;
	}
	fprintf(fp, "KD-TREES\n");
	fprintf(fp, "version %d\n", KDTREE_VERSION);
	fprintf(fp, "n_trees %d\n", n_trees);
	for (i = 0; i < n_trees; ++i) {
		fprintf(fp, "TREE %d\n", i);
		fprintf(fp, "n_density %d\n", trees[i]->n_density);
		fprintf(fp, "n_comp %d\n", trees[i]->n_comp);
		fprintf(fp, "n_level %d\n", trees[i]->n_level);
		fprintf(fp, "threshold %f\n", trees[i]->threshold);
		/* Output the nodes in depth-first ordering */
		write_kd_nodes(fp, trees[i], trees[i]->n_level);
		fprintf(fp, "\n");
	}
	fclose(fp);
	return 0;
}